

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

void __thiscall
Am_Value_List_Data::Am_Value_List_Data(Am_Value_List_Data *this,Am_Value_List_Data *proto)

{
  Am_List_Item *this_00;
  Am_List_Item **local_38;
  Am_List_Item **list_position;
  Am_List_Item *new_item;
  Am_List_Item *prev;
  Am_List_Item *current;
  Am_Value_List_Data *proto_local;
  Am_Value_List_Data *this_local;
  
  Am_Wrapper::Am_Wrapper(&this->super_Am_Wrapper);
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_004110e0;
  local_38 = &this->head;
  new_item = (Am_List_Item *)0x0;
  for (prev = proto->head; prev != (Am_List_Item *)0x0; prev = prev->next) {
    this_00 = (Am_List_Item *)operator_new(0x20);
    Am_List_Item::Am_List_Item(this_00);
    Am_List_Item::operator=(this_00,prev);
    this_00->prev = new_item;
    *local_38 = this_00;
    local_38 = &this_00->next;
    new_item = this_00;
  }
  *local_38 = (Am_List_Item *)0x0;
  this->tail = new_item;
  *(undefined2 *)&(this->super_Am_Wrapper).field_0xc =
       *(undefined2 *)&(proto->super_Am_Wrapper).field_0xc;
  return;
}

Assistant:

Am_Value_List_Data::Am_Value_List_Data(Am_Value_List_Data *proto)
{
  Am_List_Item *current;
  Am_List_Item *prev;
  Am_List_Item *new_item;
  Am_List_Item **list_position;
  list_position = &head;
  new_item = nullptr;
  prev = nullptr;
  for (current = proto->head; current; current = current->next) {
    new_item = new Am_List_Item;
    *new_item = *current;
    new_item->prev = prev;
    *list_position = new_item;
    prev = new_item;
    list_position = &(new_item->next);
  }
  *list_position = nullptr;
  tail = new_item;
  number = proto->number;
}